

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O0

int __thiscall TPZInterpolatedElement::NSideShapeF(TPZInterpolatedElement *this,int side)

{
  uchar uVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  TPZConnect *this_00;
  undefined4 in_ESI;
  long *in_RDI;
  TPZConnect *c;
  int res;
  int in;
  int ns;
  undefined4 local_18;
  undefined4 local_14;
  
  iVar2 = (**(code **)(*in_RDI + 0x248))(in_RDI,in_ESI);
  local_18 = 0;
  for (local_14 = 0; local_14 < iVar2; local_14 = local_14 + 1) {
    uVar3 = (**(code **)(*in_RDI + 0x250))(in_RDI,local_14,in_ESI);
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,uVar3);
    uVar3 = (**(code **)(*in_RDI + 0x250))(in_RDI,local_14,in_ESI);
    uVar1 = TPZConnect::Order(this_00);
    iVar4 = (**(code **)(*in_RDI + 0x260))(in_RDI,uVar3,uVar1);
    local_18 = iVar4 + local_18;
  }
  return local_18;
}

Assistant:

int TPZInterpolatedElement::NSideShapeF(int side) const {
    int ns = NSideConnects(side);
    int in, res = 0;
    for (in = 0; in < ns; in++) {
        TPZConnect &c = Connect(SideConnectLocId(in, side));
        res += NConnectShapeF(SideConnectLocId(in, side), c.Order());
    }
    return res;
}